

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O2

int xmlCopyCharMultiByte(xmlChar *out,int val)

{
  sbyte sVar1;
  int iVar2;
  undefined8 in_RCX;
  long lVar3;
  byte bVar4;
  
  lVar3 = 0;
  if (val >= 0 && out != (xmlChar *)0x0) {
    if ((uint)val < 0x80) {
      *out = (xmlChar)val;
      lVar3 = 1;
    }
    else {
      if ((uint)val < 0x800) {
        iVar2 = 0;
        bVar4 = 0xc0;
        sVar1 = 6;
      }
      else if ((uint)val < 0x10000) {
        iVar2 = 6;
        bVar4 = 0xe0;
        sVar1 = 0xc;
      }
      else {
        if (0x10ffff < (uint)val) {
          lVar3 = 0;
          xmlErrEncodingInt((xmlParserCtxtPtr)0x0,0x1e655a,(char *)(ulong)(uint)val,
                            (int)CONCAT71((int7)((ulong)in_RCX >> 8),
                                          val < 0 || out == (xmlChar *)0x0));
          goto LAB_0016760e;
        }
        iVar2 = 0xc;
        bVar4 = 0xf0;
        sVar1 = 0x12;
      }
      *out = (byte)((uint)val >> sVar1) | bVar4;
      lVar3 = 1;
      for (; -1 < iVar2; iVar2 = iVar2 + -6) {
        out[lVar3] = (byte)((uint)val >> ((byte)iVar2 & 0x1f)) & 0x3f | 0x80;
        lVar3 = lVar3 + 1;
      }
    }
  }
LAB_0016760e:
  return (int)lVar3;
}

Assistant:

int
xmlCopyCharMultiByte(xmlChar *out, int val) {
    if ((out == NULL) || (val < 0)) return(0);
    /*
     * We are supposed to handle UTF8, check it's valid
     * From rfc2044: encoding of the Unicode values on UTF-8:
     *
     * UCS-4 range (hex.)           UTF-8 octet sequence (binary)
     * 0000 0000-0000 007F   0xxxxxxx
     * 0000 0080-0000 07FF   110xxxxx 10xxxxxx
     * 0000 0800-0000 FFFF   1110xxxx 10xxxxxx 10xxxxxx
     */
    if  (val >= 0x80) {
	xmlChar *savedout = out;
	int bits;
	if (val <   0x800) { *out++= (val >>  6) | 0xC0;  bits=  0; }
	else if (val < 0x10000) { *out++= (val >> 12) | 0xE0;  bits=  6;}
	else if (val < 0x110000)  { *out++= (val >> 18) | 0xF0;  bits=  12; }
	else {
	    xmlErrEncodingInt(NULL, XML_ERR_INVALID_CHAR,
		    "Internal error, xmlCopyCharMultiByte 0x%X out of bound\n",
			      val);
	    return(0);
	}
	for ( ; bits >= 0; bits-= 6)
	    *out++= ((val >> bits) & 0x3F) | 0x80 ;
	return (out - savedout);
    }
    *out = val;
    return 1;
}